

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_tests.cpp
# Opt level: O3

void __thiscall random_tests::fastrandom_randbits::test_method(fastrandom_randbits *this)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  uint64_t uVar4;
  int iVar5;
  ulong uVar6;
  iterator in_R8;
  iterator pvVar7;
  iterator in_R9;
  iterator pvVar8;
  ulong uVar9;
  long lVar10;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  check_type cVar11;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  undefined4 local_20c;
  ulong local_208;
  undefined1 local_200 [16];
  undefined1 *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined4 *local_1c0;
  assertion_result local_1b8;
  undefined4 **local_1a0;
  ulong *local_198;
  lazy_ostream local_190;
  undefined1 *local_180;
  ulong **local_178;
  char *local_170;
  char *local_168;
  assertion_result local_160;
  FastRandomContext ctx2;
  FastRandomContext ctx1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  FastRandomContext::FastRandomContext(&ctx1,false);
  FastRandomContext::FastRandomContext(&ctx2,false);
  lVar10 = 0;
  do {
    iVar5 = 0;
    do {
      uVar4 = RandomMixin<FastRandomContext>::randbits
                        (&ctx1.super_RandomMixin<FastRandomContext>,(int)lVar10);
      local_1d0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/random_tests.cpp"
      ;
      local_1c8 = "";
      local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
      file.m_end = (iterator)0x7a;
      file.m_begin = (iterator)&local_1d0;
      msg.m_end = in_R9;
      msg.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1e0,msg)
      ;
      local_208 = uVar4 >> ((byte)lVar10 & 0x3f);
      local_160.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(local_208 == 0);
      local_200._8_8_ = local_200._8_8_ & 0xffffffffffffff00;
      local_200._0_8_ = &PTR__lazy_ostream_01388f08;
      local_1f0 = boost::unit_test::lazy_ostream::inst;
      local_1e8 = "";
      local_20c = 0;
      local_160.m_message.px = (element_type *)0x0;
      local_160.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_170 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/random_tests.cpp"
      ;
      local_168 = "";
      local_198 = &local_208;
      local_190.m_empty = false;
      local_190._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f48;
      local_180 = boost::unit_test::lazy_ostream::inst;
      local_178 = &local_198;
      local_1c0 = &local_20c;
      local_1b8.m_message.px = (element_type *)((ulong)local_1b8.m_message.px & 0xffffffffffffff00);
      local_1b8._0_8_ = &PTR__lazy_ostream_01388f88;
      local_1b8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_1a0 = &local_1c0;
      pvVar7 = (iterator)0x1;
      pvVar8 = (iterator)0x2;
      boost::test_tools::tt_detail::report_assertion
                (&local_160,(lazy_ostream *)local_200,1,2,REQUIRE,0xe9a06d,(size_t)&local_170,0x7a,
                 &local_190,"0U",&local_1b8);
      boost::detail::shared_count::~shared_count(&local_160.m_message.pn);
      uVar6 = uVar4 | 1L << ((byte)lVar10 & 0x3f);
      uVar9 = uVar6 - 1;
      if (uVar9 == 0) {
        uVar3 = 0x40;
      }
      else {
        lVar2 = 0x3f;
        if (uVar9 != 0) {
          for (; uVar9 >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        uVar3 = (uint)lVar2 ^ 0x3f;
      }
      do {
        uVar4 = RandomMixin<FastRandomContext>::randbits
                          (&ctx2.super_RandomMixin<FastRandomContext>,0x40 - uVar3);
      } while (uVar9 < uVar4);
      local_220 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/random_tests.cpp"
      ;
      local_218 = "";
      local_230 = &boost::unit_test::basic_cstring<char_const>::null;
      local_228 = &boost::unit_test::basic_cstring<char_const>::null;
      _cVar11 = 0x53328a;
      file_00.m_end = (iterator)0x7d;
      file_00.m_begin = (iterator)&local_220;
      msg_00.m_end = pvVar8;
      msg_00.m_begin = pvVar7;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_230,
                 msg_00);
      local_1b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)(uVar4 < uVar6);
      local_1b8.m_message.px = (element_type *)0x0;
      local_1b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_200._0_8_ = "rand < range";
      local_200._8_8_ = "";
      local_190.m_empty = false;
      local_190._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
      local_180 = boost::unit_test::lazy_ostream::inst;
      local_178 = (ulong **)local_200;
      local_240 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/random_tests.cpp"
      ;
      local_238 = "";
      in_R8 = (iterator)0x1;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_1b8,&local_190,1,0,WARN,_cVar11,(size_t)&local_240,0x7d);
      boost::detail::shared_count::~shared_count(&local_1b8.m_message.pn);
      iVar5 = iVar5 + 1;
    } while (iVar5 != 1000);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x3f);
  ChaCha20::~ChaCha20(&ctx2.rng);
  ChaCha20::~ChaCha20(&ctx1.rng);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(fastrandom_randbits)
{
    FastRandomContext ctx1;
    FastRandomContext ctx2;
    for (int bits = 0; bits < 63; ++bits) {
        for (int j = 0; j < 1000; ++j) {
            uint64_t rangebits = ctx1.randbits(bits);
            BOOST_CHECK_EQUAL(rangebits >> bits, 0U);
            uint64_t range = (uint64_t{1}) << bits | rangebits;
            uint64_t rand = ctx2.randrange(range);
            BOOST_CHECK(rand < range);
        }
    }
}